

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O3

uint32_t __thiscall
bits::detail::
RadixSort<8U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<8U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,unsigned_long *keys_in,unsigned_long *keys_temp,uint *values_in,uint *values_temp,
          uint32_t size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint *values [2];
  unsigned_long *keys [2];
  uint32_t sum [8];
  uint32_t hist [8] [256];
  uint *local_2088 [2];
  unsigned_long *local_2078 [4];
  uint auStack_2058 [8];
  uint local_2038 [1792];
  uint auStack_438 [258];
  
  uVar5 = (ulong)size;
  memset(local_2038,0,0x2000);
  if (size != 0) {
    uVar8 = 0;
    do {
      uVar13 = keys_in[uVar8];
      lVar6 = 0;
      puVar7 = local_2038;
      do {
        puVar7[uVar13 >> ((byte)lVar6 & 0x3f) & 0xff] =
             puVar7[uVar13 >> ((byte)lVar6 & 0x3f) & 0xff] + 1;
        puVar7 = puVar7 + 0x100;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x40);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
  }
  puVar7 = local_2038;
  lVar6 = 0;
  do {
    auStack_2058[lVar6] = *puVar7;
    *puVar7 = 0;
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x100;
  } while (lVar6 != 8);
  lVar6 = 1;
  puVar7 = local_2038;
  do {
    puVar7 = puVar7 + 1;
    lVar11 = 0;
    puVar9 = puVar7;
    do {
      uVar12 = auStack_2058[lVar11];
      uVar1 = *puVar9;
      *puVar9 = uVar12;
      auStack_2058[lVar11] = uVar1 + uVar12;
      lVar11 = lVar11 + 1;
      puVar9 = puVar9 + 0x100;
    } while (lVar11 != 8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  local_2078[0] = keys_in;
  local_2078[1] = keys_temp;
  local_2088[0] = values_in;
  local_2088[1] = values_temp;
  if (size == 0) {
    uVar5 = 0;
  }
  else {
    uVar8 = 0;
    do {
      uVar13 = keys_in[uVar8];
      uVar10 = uVar13 & 0xff;
      uVar12 = local_2038[uVar10];
      local_2038[uVar10] = uVar12 + 1;
      keys_temp[uVar12] = uVar13;
      values_temp[uVar12] = values_in[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  lVar6 = 1;
  local_2078[3] = keys_temp;
  local_2078[2] = keys_in;
  do {
    while (size == 0) {
      lVar6 = lVar6 + 1;
      if (lVar6 == 7) {
        return 0;
      }
    }
    uVar12 = (uint)lVar6 & 1;
    uVar8 = (ulong)(uVar12 << 3);
    uVar13 = (ulong)((uVar12 ^ 1) << 3);
    lVar11 = *(long *)((long)local_2078 + uVar8);
    lVar2 = *(long *)((long)local_2078 + uVar13);
    lVar3 = *(long *)((long)local_2088 + uVar8);
    lVar4 = *(long *)((long)local_2088 + uVar13);
    uVar8 = 0;
    do {
      uVar13 = *(ulong *)(lVar11 + uVar8 * 8);
      uVar10 = uVar13 >> ((char)lVar6 * '\b' & 0x3fU) & 0xff;
      uVar12 = local_2038[lVar6 * 0x100 + uVar10];
      local_2038[lVar6 * 0x100 + uVar10] = uVar12 + 1;
      *(ulong *)(lVar2 + (ulong)uVar12 * 8) = uVar13;
      *(undefined4 *)(lVar4 + (ulong)uVar12 * 4) = *(undefined4 *)(lVar3 + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  if (size == 0) {
    return 0;
  }
  uVar8 = 0;
  do {
    uVar13 = keys_temp[uVar8];
    uVar10 = uVar13 >> 0x38;
    uVar12 = auStack_438[uVar10];
    auStack_438[uVar10] = uVar12 + 1;
    keys_in[uVar12] = uVar13;
    values_in[uVar12] = values_temp[uVar8];
    uVar8 = uVar8 + 1;
  } while (uVar5 != uVar8);
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }